

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

void __thiscall
OpenMD::Field<double>::Field
          (Field<double> *this,SimInfo *info,string *filename,string *sele,RealType voxelSize)

{
  SelectionEvaluator *this_00;
  Vector3i *pVVar1;
  double *pdVar2;
  double dVar3;
  bool bVar4;
  pointer pcVar5;
  Snapshot *this_01;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  uint i;
  int iVar14;
  SelectionSet *pSVar15;
  pointer *ppOVar16;
  long *plVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  RealType RVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double tmp_4;
  double dVar25;
  double tmp_5;
  Vector<double,_3U> v;
  Vector3<double> result;
  Mat3x3d box;
  Mat3x3d local_1b8;
  double local_168 [4];
  double local_148 [4];
  double local_128 [3];
  SelectionEvaluator *local_110;
  string *local_108;
  string *local_100;
  SelectionSet local_f8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  double local_a8 [4];
  double local_88 [4];
  double local_68 [3];
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__Field_0033ab50;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar5 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar5,pcVar5 + sele->_M_string_length);
  local_100 = filename;
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  local_108 = &this->selectionScript_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this->voxelSize_ = voxelSize;
  (this->nBins_).super_Vector<int,_3U>.data_[0] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[1] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[2] = 0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_f8,this_00);
    lVar20 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar20),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_f8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar20));
      lVar20 = lVar20 + 0x28;
    } while (lVar20 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_f8.bitsets_);
  }
  iVar14 = OpenMDBitSet::countBits
                     ((this->seleMan_).ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_e0 = 0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = 0;
  bVar4 = (bool)(((this->super_StaticAnalyser).info_)->simParams_->UsePeriodicBoundaryConditions).
                super_ParameterBase.field_0x2b;
  this->usePeriodicBoundaryConditions_ = bVar4;
  if (bVar4 == false) {
    Snapshot::getBoundingBox(&local_1b8,this->snap_);
    lVar20 = 0;
    do {
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar20) =
           *(undefined8 *)
            ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar20 + 0x10);
      uVar10 = *(undefined8 *)
                ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + lVar20 + 8);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar20) =
           *(undefined8 *)
            ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar20);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish + lVar20) = uVar10;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x48);
    Snapshot::getInvBoundingBox(&local_1b8,this->snap_);
  }
  else {
    Snapshot::getHmat(&local_1b8,this->snap_);
    lVar20 = 0;
    do {
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar20) =
           *(undefined8 *)
            ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar20 + 0x10);
      uVar10 = *(undefined8 *)
                ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + lVar20 + 8);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar20) =
           *(undefined8 *)
            ((long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar20);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish + lVar20) = uVar10;
      lVar20 = lVar20 + 0x18;
    } while (lVar20 != 0x48);
    Snapshot::getInvHmat(&local_1b8,this->snap_);
  }
  this_01 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->snap_ = this_01;
  if (iVar14 == 0) {
    dVar23 = voxelSize + voxelSize;
  }
  else {
    RVar22 = Snapshot::getVolume(this_01);
    dVar23 = pow(RVar22 / (double)iVar14,0.3333333333333333);
  }
  pVVar1 = &this->nBins_;
  this->reffective_ = dVar23;
  this->rcut_ = dVar23 * 3.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  pSVar15 = &local_f8;
  lVar20 = 0;
  do {
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar20] =
         (double)(pSVar15->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    dVar3 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    dVar25 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar23 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    lVar20 = lVar20 + 1;
    pSVar15 = pSVar15 + 1;
  } while (lVar20 != 3);
  local_68[2] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_68[0] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_68[1] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  ppOVar16 = &local_f8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  lVar20 = 0;
  do {
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar20] =
         (double)*ppOVar16;
    dVar13 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    dVar12 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar11 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    lVar20 = lVar20 + 1;
    ppOVar16 = ppOVar16 + 3;
  } while (lVar20 != 3);
  local_88[2] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_88[0] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_88[1] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  ppOVar16 = &local_f8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  lVar20 = 0;
  do {
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar20] =
         (double)*ppOVar16;
    lVar20 = lVar20 + 1;
    ppOVar16 = ppOVar16 + 3;
  } while (lVar20 != 3);
  local_a8[2] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_a8[0] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_a8[1] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_128[0] = dVar25 * dVar13 - dVar12 * dVar3;
  local_128[1] = dVar3 * dVar11 - dVar13 * dVar23;
  local_128[2] = dVar23 * dVar12 - dVar11 * dVar25;
  local_148[0] = dVar12 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] -
                 dVar13 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1];
  local_148[1] = dVar13 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][0] -
                 dVar11 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2];
  local_148[2] = dVar11 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1] -
                 local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar12;
  local_168[0] = dVar3 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][1] -
                 local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [2] * dVar25;
  local_168[1] = dVar23 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] -
                 local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar3;
  local_168[2] = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar25 -
                 dVar23 * local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1];
  dVar23 = 0.0;
  lVar20 = 0;
  do {
    dVar23 = dVar23 + local_128[lVar20] * local_128[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  lVar20 = 0;
  do {
    local_128[lVar20] = local_128[lVar20] / dVar23;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  dVar23 = 0.0;
  lVar20 = 0;
  do {
    dVar23 = dVar23 + local_148[lVar20] * local_148[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  lVar20 = 0;
  do {
    local_148[lVar20] = local_148[lVar20] / dVar23;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  dVar23 = 0.0;
  lVar20 = 0;
  do {
    dVar23 = dVar23 + local_168[lVar20] * local_168[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  lVar20 = 0;
  do {
    local_168[lVar20] = local_168[lVar20] / dVar23;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  dVar23 = 0.0;
  lVar20 = 0;
  do {
    dVar23 = dVar23 + local_68[lVar20] * local_148[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  dVar25 = 0.0;
  lVar20 = 0;
  do {
    dVar25 = dVar25 + local_88[lVar20] * local_168[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  auVar24._0_8_ = ABS(dVar23);
  dVar23 = 0.0;
  lVar20 = 0;
  do {
    dVar23 = dVar23 + local_a8[lVar20] * local_128[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  dVar3 = this->voxelSize_;
  auVar24._8_8_ = ABS(dVar25);
  auVar9._8_8_ = dVar3;
  auVar9._0_8_ = dVar3;
  auVar24 = divpd(auVar24,auVar9);
  *(ulong *)(this->nBins_).super_Vector<int,_3U>.data_ =
       CONCAT44((int)auVar24._8_8_,(int)auVar24._0_8_);
  (this->nBins_).super_Vector<int,_3U>.data_[2] = (int)(ABS(dVar23) / dVar3);
  local_110 = this_00;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->field_,(long)(int)auVar24._0_8_);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->dens_,(long)(pVVar1->super_Vector<int,_3U>).data_[0]);
  if (0 < (pVVar1->super_Vector<int,_3U>).data_[0]) {
    lVar20 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->field_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar20,
               (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->dens_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar20,
               (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
      if (0 < (this->nBins_).super_Vector<int,_3U>.data_[1]) {
        lVar21 = 0;
        lVar19 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(this->field_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar21),
                     (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(this->dens_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar21),
                     (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          lVar6 = *(long *)&(this->dens_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pvVar7 = *(void **)(lVar6 + lVar21);
          pvVar8 = *(void **)(lVar6 + 8 + lVar21);
          if (pvVar7 != pvVar8) {
            memset(pvVar7,0,((long)pvVar8 + (-8 - (long)pvVar7) & 0xfffffffffffffff8U) + 8);
          }
          lVar6 = *(long *)&(this->field_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pvVar7 = *(void **)(lVar6 + lVar21);
          pvVar8 = *(void **)(lVar6 + 8 + lVar21);
          if (pvVar7 != pvVar8) {
            memset(pvVar7,0,((long)pvVar8 + (-8 - (long)pvVar7) & 0xfffffffffffffff8U) + 8);
          }
          lVar19 = lVar19 + 1;
          lVar21 = lVar21 + 0x18;
        } while (lVar19 < (this->nBins_).super_Vector<int,_3U>.data_[1]);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (pVVar1->super_Vector<int,_3U>).data_[0]);
  }
  getPrefix(&local_50,local_100);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
  pdVar2 = local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
  pdVar18 = (double *)(plVar17 + 2);
  if ((double *)*plVar17 == pdVar18) {
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar18;
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         (double)plVar17[3];
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)pdVar2;
  }
  else {
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar18;
    local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)*plVar17;
  }
  local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       (double)plVar17[1];
  *plVar17 = (long)pdVar18;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((double *)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar2) {
    operator_delete((void *)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0],
                    (long)local_1b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Field<T>::Field(SimInfo* info, const std::string& filename,
                  const std::string& sele, RealType voxelSize) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info),
      voxelSize_(voxelSize) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    int nSelected = seleMan_.getSelectionCount();

    Mat3x3d box;
    Mat3x3d invBox;

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    // reff will be used in the gaussian weighting of the
    // should be based on r_{effective}
    snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (nSelected == 0) {
      reffective_ = 2.0 * voxelSize;
    } else {
      reffective_ = pow((snap_->getVolume() / nSelected), 1. / 3.);
    }
    rcut_ = 3.0 * reffective_;

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nBins_.x() = int(Wa / voxelSize_);
    nBins_.y() = int(Wb / voxelSize_);
    nBins_.z() = int(Wc / voxelSize_);

    // Build the field histogram and dens histogram and fill with zeros.
    field_.resize(nBins_.x());
    dens_.resize(nBins_.x());
    for (int i = 0; i < nBins_.x(); ++i) {
      field_[i].resize(nBins_.y());
      dens_[i].resize(nBins_.y());
      for (int j = 0; j < nBins_.y(); ++j) {
        field_[i][j].resize(nBins_.z());
        dens_[i][j].resize(nBins_.z());

        std::fill(dens_[i][j].begin(), dens_[i][j].end(), 0.0);
        std::fill(field_[i][j].begin(), field_[i][j].end(), T(0.0));
      }
    }

    setOutputName(getPrefix(filename) + ".field");
  }